

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

void __thiscall
diy::AMRLink::Description::Description
          (Description *this,int level_,Point *refinement_,Bounds *core_,Bounds *bounds_)

{
  this->level = level_;
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            (&(this->refinement).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,
             &refinement_->super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>);
  Bounds<int>::Bounds(&this->core,core_);
  Bounds<int>::Bounds(&this->bounds,bounds_);
  return;
}

Assistant:

Description(int level_, Point refinement_, Bounds core_, Bounds bounds_):
                        level(level_), refinement(refinement_), core(core_), bounds(bounds_)    {}